

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *buffer;
  
  buffer = (this->super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>)
           .next.node;
  while (buffer != (DListNode<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this)
  {
    pDVar1 = (buffer->
             super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
             .node;
    Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>::~SegmentBase(&buffer->data);
    Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x40);
    buffer = pDVar1;
  }
  (this->super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next.
  list = this;
  (this->super_DListNodeBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).prev.
  list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }